

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# termcolor.hpp
# Opt level: O0

ostream * termcolor::color<(unsigned_char)128,(unsigned_char)128,(unsigned_char)128>
                    (ostream *stream)

{
  bool bVar1;
  ostream *in_RDI;
  char command [20];
  char acStackY_28 [8];
  ostream *in_stack_ffffffffffffffe0;
  
  bVar1 = _internal::is_colorized(in_stack_ffffffffffffffe0);
  if (bVar1) {
    snprintf(acStackY_28,0x14,"\x1b[38;2;%d;%d;%dm",0x80,0x80);
    std::operator<<(in_RDI,acStackY_28);
  }
  return in_RDI;
}

Assistant:

inline std::ostream &color(std::ostream &stream) {
	if (_internal::is_colorized(stream)) {
#if defined(TERMCOLOR_OS_MACOS) || defined(TERMCOLOR_OS_LINUX)
		char command[20];
		std::snprintf(command, sizeof(command), "\033[38;2;%d;%d;%dm", r, g, b);
		stream << command;
#elif defined(TERMCOLOR_OS_WINDOWS)
#endif
	}
	return stream;
}